

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  size_type sVar3;
  reference pvVar4;
  int local_27c;
  long lStack_278;
  int i;
  long sum;
  int local_25c;
  undefined1 local_258 [4];
  int number;
  vector<int,_std::allocator<int>_> primes;
  string line;
  istream local_220 [8];
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220,argv[1],8);
  std::__cxx11::string::string
            ((string *)
             &primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_258);
  local_25c = 2;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_220,
                        (string *)
                        &primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  } while (bVar1);
  while (sVar3 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)local_258), sVar3 < 1000) {
    bVar1 = isPrime(&local_25c);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_258,&local_25c);
    }
    local_25c = local_25c + 1;
  }
  lStack_278 = 0;
  for (local_27c = 0;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_258),
      (ulong)(long)local_27c < sVar3; local_27c = local_27c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_258,(long)local_27c);
    lStack_278 = *pvVar4 + lStack_278;
  }
  std::ostream::operator<<((ostream *)&std::cout,lStack_278);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_258);
  std::__cxx11::string::~string
            ((string *)
             &primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
    string line;

    std::vector<int> primes;
    int number = 2;
    while (getline(stream, line)) {
    }

    while (primes.size() < 1000) {
        if (isPrime(number)) {
            primes.push_back(number);
        }
        number++;
    }

    long int sum = 0;
    for (int i = 0; i < primes.size(); i++) {
        sum += primes[i];
    }

    std::cout << sum;
    return 0;
}